

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMUnaryOp.cpp
# Opt level: O0

void __thiscall xercesc_4_0::CMUnaryOp::calcLastPos(CMUnaryOp *this,CMStateSet *toSet)

{
  CMStateSet *srcSet;
  CMStateSet *toSet_local;
  CMUnaryOp *this_local;
  
  srcSet = CMNode::getLastPos(this->fChild);
  CMStateSet::operator=(toSet,srcSet);
  return;
}

Assistant:

void CMUnaryOp::calcLastPos(CMStateSet& toSet) const
{
    // Its just based on our child node's last pos
    toSet = fChild->getLastPos();
}